

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::ClassPropertySymbol::serializeTo(ClassPropertySymbol *this,ASTSerializer *serializer)

{
  string_view sVar1;
  
  VariableSymbol::serializeTo(&this->super_VariableSymbol,serializer);
  sVar1 = ast::toString(this->visibility);
  ASTSerializer::write(serializer,10,"visibility",sVar1._M_len);
  if (this->randMode != None) {
    sVar1 = ast::toString(this->randMode);
    ASTSerializer::write(serializer,8,"randMode",sVar1._M_len);
    return;
  }
  return;
}

Assistant:

void ClassPropertySymbol::serializeTo(ASTSerializer& serializer) const {
    VariableSymbol::serializeTo(serializer);
    serializer.write("visibility", toString(visibility));
    if (randMode != RandMode::None)
        serializer.write("randMode", toString(randMode));
}